

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall xmrig::Miner::onConfigChanged(Miner *this,Config *config,Config *previousConfig)

{
  pointer ppIVar1;
  bool bVar2;
  size_t sVar3;
  Pools *this_00;
  pointer ppIVar4;
  Job job;
  Job local_120;
  
  this_00 = &(config->super_BaseConfig).m_pools;
  bVar2 = Pools::isEqual(this_00,&(previousConfig->super_BaseConfig).m_pools);
  if ((!bVar2) && (sVar3 = Pools::active(this_00), sVar3 != 0)) {
    return;
  }
  Miner::job(&local_120,this);
  ppIVar4 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar4 != ppIVar1) {
    do {
      (*(*ppIVar4)->_vptr_IBackend[9])(*ppIVar4,&local_120);
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 != ppIVar1);
  }
  Job::~Job(&local_120);
  return;
}

Assistant:

void xmrig::Miner::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() != previousConfig->pools() && config->pools().active() > 0) {
        return;
    }

    const Job job = this->job();

    for (IBackend *backend : d_ptr->backends) {
        backend->setJob(job);
    }
}